

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O3

BufferSp __thiscall
vkt::SpirVAssembly::getBuffer(SpirVAssembly *this,IntegerType type,deInt64 number)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  SharedPtrStateBase *pSVar3;
  SharedPtrStateBase *extraout_RDX;
  SharedPtrStateBase *extraout_RDX_00;
  BufferSp BVar4;
  vector<int,_std::allocator<int>_> local_28;
  
  switch(type) {
  case INTEGER_TYPE_SIGNED_16:
    BVar4 = getSpecializedBuffer<short>(this,number);
    pSVar3 = BVar4.m_state;
    break;
  case INTEGER_TYPE_SIGNED_32:
    BVar4 = getSpecializedBuffer<int>(this,number);
    pSVar3 = BVar4.m_state;
    break;
  case INTEGER_TYPE_SIGNED_64:
    BVar4 = getSpecializedBuffer<long>(this,number);
    pSVar3 = BVar4.m_state;
    break;
  case INTEGER_TYPE_UNSIGNED_16:
    BVar4 = getSpecializedBuffer<unsigned_short>(this,number);
    pSVar3 = BVar4.m_state;
    break;
  case INTEGER_TYPE_UNSIGNED_32:
    BVar4 = getSpecializedBuffer<unsigned_int>(this,number);
    pSVar3 = BVar4.m_state;
    break;
  case INTEGER_TYPE_UNSIGNED_64:
    BVar4 = getSpecializedBuffer<unsigned_long>(this,number);
    pSVar3 = BVar4.m_state;
    break;
  default:
    puVar1 = (undefined8 *)operator_new(0x20);
    local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)operator_new(4);
    local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start + 1;
    *local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = 0;
    *puVar1 = &PTR__Buffer_00d2b318;
    local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)(puVar1 + 1),&local_28);
    *(undefined8 *)(this + 8) = 0;
    *(undefined8 **)this = puVar1;
    puVar2 = (undefined8 *)operator_new(0x20);
    *(undefined4 *)(puVar2 + 1) = 0;
    *(undefined4 *)((long)puVar2 + 0xc) = 0;
    *puVar2 = &PTR__SharedPtrState_00d2b2d8;
    puVar2[2] = puVar1;
    *(undefined8 **)(this + 8) = puVar2;
    *(undefined4 *)(puVar2 + 1) = 1;
    *(undefined4 *)((long)puVar2 + 0xc) = 1;
    pSVar3 = extraout_RDX;
    if (local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
      pSVar3 = extraout_RDX_00;
    }
  }
  BVar4.m_state = pSVar3;
  BVar4.m_ptr = (BufferInterface *)this;
  return BVar4;
}

Assistant:

BufferSp getBuffer (IntegerType type, deInt64 number)
{
	switch (type)
	{
		case INTEGER_TYPE_SIGNED_16:	return getSpecializedBuffer<deInt16>(number);
		case INTEGER_TYPE_SIGNED_32:	return getSpecializedBuffer<deInt32>(number);
		case INTEGER_TYPE_SIGNED_64:	return getSpecializedBuffer<deInt64>(number);

		case INTEGER_TYPE_UNSIGNED_16:	return getSpecializedBuffer<deUint16>(number);
		case INTEGER_TYPE_UNSIGNED_32:	return getSpecializedBuffer<deUint32>(number);
		case INTEGER_TYPE_UNSIGNED_64:	return getSpecializedBuffer<deUint64>(number);

		default:						DE_ASSERT(false);
										return BufferSp(new Buffer<deInt32>(vector<deInt32>(1, 0)));
	}
}